

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::BVHNIntersector1<8,_16781328,_false,_embree::avx2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  float fVar8;
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  undefined1 (*pauVar26) [16];
  ulong uVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined4 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  uint uVar48;
  undefined1 auVar47 [16];
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  vint8 bi;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined4 local_2560;
  undefined4 uStack_255c;
  undefined4 uStack_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined4 local_2540;
  undefined4 uStack_253c;
  undefined4 uStack_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  undefined4 local_2520;
  undefined4 uStack_251c;
  undefined4 uStack_2518;
  undefined4 uStack_2514;
  undefined4 uStack_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  float local_23e0 [4];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [16];
  undefined1 local_23b0 [16];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar38 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar42 = vrsqrtss_avx(auVar38,auVar38);
    fVar46 = auVar42._0_4_;
    local_24c0 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    uStack_24bc = local_24c0;
    uStack_24b8 = local_24c0;
    uStack_24b4 = local_24c0;
    uStack_24b0 = local_24c0;
    uStack_24ac = local_24c0;
    uStack_24a8 = local_24c0;
    uStack_24a4 = local_24c0;
    local_23e0[0] = fVar46 * 1.5 - auVar38._0_4_ * 0.5 * fVar46 * fVar46 * fVar46;
    local_24e0 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    uStack_24dc = local_24e0;
    uStack_24d8 = local_24e0;
    uStack_24d4 = local_24e0;
    uStack_24d0 = local_24e0;
    uStack_24cc = local_24e0;
    uStack_24c8 = local_24e0;
    uStack_24c4 = local_24e0;
    auVar49._0_4_ = aVar2.x * local_23e0[0];
    auVar49._4_4_ = aVar2.y * local_23e0[0];
    auVar49._8_4_ = aVar2.z * local_23e0[0];
    auVar49._12_4_ = aVar2.field_3.w * local_23e0[0];
    auVar42 = vshufpd_avx(auVar49,auVar49,1);
    auVar37._8_4_ = 0x80000000;
    auVar37._0_8_ = 0x8000000080000000;
    auVar37._12_4_ = 0x80000000;
    auVar38 = vmovshdup_avx(auVar49);
    auVar52._12_4_ = 0;
    auVar52._0_12_ = ZEXT812(0);
    auVar52 = auVar52 << 0x20;
    auVar60 = vunpckhps_avx(auVar49,auVar52);
    auVar50 = vshufps_avx(auVar60,ZEXT416(auVar38._0_4_ ^ 0x80000000),0x41);
    auVar60._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
    auVar60._8_8_ = auVar42._8_8_ ^ auVar37._8_8_;
    auVar60 = vinsertps_avx(auVar60,auVar49,0x2a);
    auVar38 = vdpps_avx(auVar50,auVar50,0x7f);
    auVar42 = vdpps_avx(auVar60,auVar60,0x7f);
    auVar38 = vcmpps_avx(auVar42,auVar38,1);
    auVar64._0_4_ = auVar38._0_4_;
    auVar64._4_4_ = auVar64._0_4_;
    auVar64._8_4_ = auVar64._0_4_;
    auVar64._12_4_ = auVar64._0_4_;
    auVar38 = vblendvps_avx(auVar60,auVar50,auVar64);
    auVar42 = vdpps_avx(auVar38,auVar38,0x7f);
    local_2500 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_24fc = local_2500;
    fStack_24f8 = local_2500;
    fStack_24f4 = local_2500;
    fStack_24f0 = local_2500;
    fStack_24ec = local_2500;
    fStack_24e8 = local_2500;
    fStack_24e4 = local_2500;
    auVar60 = vrsqrtss_avx(auVar42,auVar42);
    fVar46 = auVar60._0_4_;
    fVar46 = fVar46 * 1.5 - auVar42._0_4_ * 0.5 * fVar46 * fVar46 * fVar46;
    auVar61._0_4_ = auVar38._0_4_ * fVar46;
    auVar61._4_4_ = auVar38._4_4_ * fVar46;
    auVar61._8_4_ = auVar38._8_4_ * fVar46;
    auVar61._12_4_ = auVar38._12_4_ * fVar46;
    auVar38 = vshufps_avx(auVar61,auVar61,0xc9);
    auVar42 = vshufps_avx(auVar49,auVar49,0xc9);
    auVar65._0_4_ = auVar61._0_4_ * auVar42._0_4_;
    auVar65._4_4_ = auVar61._4_4_ * auVar42._4_4_;
    auVar65._8_4_ = auVar61._8_4_ * auVar42._8_4_;
    auVar65._12_4_ = auVar61._12_4_ * auVar42._12_4_;
    auVar38 = vfmsub231ps_fma(auVar65,auVar49,auVar38);
    auVar60 = vshufps_avx(auVar38,auVar38,0xc9);
    auVar38 = vdpps_avx(auVar60,auVar60,0x7f);
    auVar42 = vrsqrtss_avx(auVar38,auVar38);
    fVar46 = auVar42._0_4_;
    fVar46 = fVar46 * 1.5 - auVar38._0_4_ * 0.5 * fVar46 * fVar46 * fVar46;
    auVar42._0_4_ = auVar60._0_4_ * fVar46;
    auVar42._4_4_ = auVar60._4_4_ * fVar46;
    auVar42._8_4_ = auVar60._8_4_ * fVar46;
    auVar42._12_4_ = auVar60._12_4_ * fVar46;
    auVar38._0_4_ = local_23e0[0] * auVar49._0_4_;
    auVar38._4_4_ = local_23e0[0] * auVar49._4_4_;
    auVar38._8_4_ = local_23e0[0] * auVar49._8_4_;
    auVar38._12_4_ = local_23e0[0] * auVar49._12_4_;
    auVar60 = vunpcklps_avx(auVar61,auVar38);
    auVar38 = vunpckhps_avx(auVar61,auVar38);
    auVar50 = vunpcklps_avx(auVar42,auVar52);
    auVar42 = vunpckhps_avx(auVar42,auVar52);
    local_23b0 = vunpcklps_avx(auVar38,auVar42);
    local_23d0 = vunpcklps_avx(auVar60,auVar50);
    local_23c0 = vunpckhps_avx(auVar60,auVar50);
    pauVar22 = (undefined1 (*) [16])local_2390;
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar60 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar50._8_4_ = 0x7fffffff;
    auVar50._0_8_ = 0x7fffffff7fffffff;
    auVar50._12_4_ = 0x7fffffff;
    uStack_2398 = 0;
    auVar38 = vandps_avx((undefined1  [16])aVar2,auVar50);
    auVar53._8_4_ = 0x219392ef;
    auVar53._0_8_ = 0x219392ef219392ef;
    auVar53._12_4_ = 0x219392ef;
    auVar38 = vcmpps_avx(auVar38,auVar53,1);
    auVar38 = vblendvps_avx((undefined1  [16])aVar2,auVar53,auVar38);
    auVar50 = vrcpps_avx(auVar38);
    auVar54._8_4_ = 0x3f800000;
    auVar54._0_8_ = 0x3f8000003f800000;
    auVar54._12_4_ = 0x3f800000;
    auVar38 = vfnmadd231ps_fma(auVar54,auVar50,auVar38);
    auVar37 = vfmadd132ps_fma(auVar38,auVar50,auVar50);
    local_2520 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    uStack_251c = local_2520;
    uStack_2518 = local_2520;
    uStack_2514 = local_2520;
    uStack_2510 = local_2520;
    uStack_250c = local_2520;
    uStack_2508 = local_2520;
    uStack_2504 = local_2520;
    local_2540 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    uStack_253c = local_2540;
    uStack_2538 = local_2540;
    uStack_2534 = local_2540;
    uStack_2530 = local_2540;
    uStack_252c = local_2540;
    uStack_2528 = local_2540;
    uStack_2524 = local_2540;
    local_2560 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    uStack_255c = local_2560;
    uStack_2558 = local_2560;
    uStack_2554 = local_2560;
    uStack_2550 = local_2560;
    uStack_254c = local_2560;
    uStack_2548 = local_2560;
    uStack_2544 = local_2560;
    fVar46 = auVar37._0_4_;
    auVar62._4_4_ = fVar46;
    auVar62._0_4_ = fVar46;
    auVar62._8_4_ = fVar46;
    auVar62._12_4_ = fVar46;
    auVar62._16_4_ = fVar46;
    auVar62._20_4_ = fVar46;
    auVar62._24_4_ = fVar46;
    auVar62._28_4_ = fVar46;
    auVar38 = vmovshdup_avx(auVar37);
    uVar35 = auVar38._0_8_;
    auVar63._8_8_ = uVar35;
    auVar63._0_8_ = uVar35;
    auVar63._16_8_ = uVar35;
    auVar63._24_8_ = uVar35;
    auVar50 = vshufpd_avx(auVar37,auVar37,1);
    auVar52 = vshufps_avx(auVar37,auVar37,0xaa);
    uVar35 = auVar52._0_8_;
    auVar66._8_8_ = uVar35;
    auVar66._0_8_ = uVar35;
    auVar66._16_8_ = uVar35;
    auVar66._24_8_ = uVar35;
    auVar55._0_4_ = fVar46 * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar55._4_4_ = auVar37._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar55._8_4_ = auVar37._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar55._12_4_ = auVar37._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    uVar33 = (ulong)(fVar46 < 0.0) * 0x20;
    uVar32 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
    auVar38 = vmovshdup_avx(auVar55);
    auVar52 = vshufps_avx(auVar55,auVar55,0xaa);
    uVar34 = (ulong)(auVar50._0_4_ < 0.0) << 5 | 0x80;
    uVar43 = auVar42._0_4_;
    auVar56._4_4_ = uVar43;
    auVar56._0_4_ = uVar43;
    auVar56._8_4_ = uVar43;
    auVar56._12_4_ = uVar43;
    auVar56._16_4_ = uVar43;
    auVar56._20_4_ = uVar43;
    auVar56._24_4_ = uVar43;
    auVar56._28_4_ = uVar43;
    uVar43 = auVar60._0_4_;
    auVar36 = ZEXT3264(CONCAT428(uVar43,CONCAT424(uVar43,CONCAT420(uVar43,CONCAT416(uVar43,CONCAT412
                                                  (uVar43,CONCAT48(uVar43,CONCAT44(uVar43,uVar43))))
                                                  ))));
    uVar23 = CONCAT44(auVar55._0_4_,auVar55._0_4_);
    auVar59._0_8_ = uVar23 ^ 0x8000000080000000;
    auVar59._8_4_ = -auVar55._0_4_;
    auVar59._12_4_ = -auVar55._0_4_;
    auVar59._16_4_ = -auVar55._0_4_;
    auVar59._20_4_ = -auVar55._0_4_;
    auVar59._24_4_ = -auVar55._0_4_;
    auVar59._28_4_ = -auVar55._0_4_;
    uVar30 = auVar38._0_4_;
    uVar48 = auVar38._4_4_;
    auVar69._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    auVar69._8_4_ = uVar30 ^ 0x80000000;
    auVar69._12_4_ = uVar48 ^ 0x80000000;
    auVar69._16_4_ = uVar30 ^ 0x80000000;
    auVar69._20_4_ = uVar48 ^ 0x80000000;
    auVar69._24_4_ = uVar30 ^ 0x80000000;
    auVar69._28_4_ = uVar48 ^ 0x80000000;
    uVar30 = auVar52._0_4_;
    uVar48 = auVar52._4_4_;
    auVar70._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
    auVar70._8_4_ = uVar30 ^ 0x80000000;
    auVar70._12_4_ = uVar48 ^ 0x80000000;
    auVar70._16_4_ = uVar30 ^ 0x80000000;
    auVar70._20_4_ = uVar48 ^ 0x80000000;
    auVar70._24_4_ = uVar30 ^ 0x80000000;
    auVar70._28_4_ = uVar48 ^ 0x80000000;
    do {
      pauVar21 = pauVar22 + -1;
      pauVar22 = pauVar22 + -1;
      if (*(float *)(*pauVar21 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar21 = pauVar22;
        uVar23 = *(ulong *)*pauVar22;
        while (pauVar22 = pauVar21, (uVar23 & 8) == 0) {
          fVar46 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar30 = (uint)uVar23 & 7;
          uVar25 = uVar23 & 0xfffffffffffffff0;
          if (uVar30 == 3) {
            local_2440 = *(undefined1 (*) [32])(uVar25 + 0x40);
            local_2420 = *(undefined1 (*) [32])(uVar25 + 0x60);
            pauVar1 = (undefined1 (*) [32])(uVar25 + 0x80);
            local_2580 = *(undefined8 *)*pauVar1;
            uStack_2578 = *(undefined8 *)(uVar25 + 0x88);
            uStack_2570 = *(undefined8 *)(uVar25 + 0x90);
            uStack_2568 = *(undefined8 *)(uVar25 + 0x98);
            local_2460 = *(undefined1 (*) [32])(uVar25 + 0xa0);
            local_2400 = *(undefined1 (*) [32])(uVar25 + 0xc0);
            local_2480 = *(undefined1 (*) [32])(uVar25 + 0xe0);
            auVar10 = *(undefined1 (*) [32])(uVar25 + 0x100);
            auVar11 = *(undefined1 (*) [32])(uVar25 + 0x120);
            auVar12 = *(undefined1 (*) [32])(uVar25 + 0x140);
            fVar8 = 1.0 - fVar46;
            auVar72._4_4_ = fVar8;
            auVar72._0_4_ = fVar8;
            auVar72._8_4_ = fVar8;
            auVar72._12_4_ = fVar8;
            auVar72._16_4_ = fVar8;
            auVar72._20_4_ = fVar8;
            auVar72._24_4_ = fVar8;
            auVar72._28_4_ = fVar8;
            local_24a0._0_4_ = fVar46 * *(float *)(uVar25 + 0x1c0);
            local_24a0._4_4_ = fVar46 * *(float *)(uVar25 + 0x1c4);
            local_24a0._8_4_ = fVar46 * *(float *)(uVar25 + 0x1c8);
            local_24a0._12_4_ = fVar46 * *(float *)(uVar25 + 0x1cc);
            local_24a0._16_4_ = fVar46 * *(float *)(uVar25 + 0x1d0);
            local_24a0._20_4_ = fVar46 * *(float *)(uVar25 + 0x1d4);
            local_24a0._24_4_ = fVar46 * *(float *)(uVar25 + 0x1d8);
            local_24a0._28_4_ = 0;
            auVar4._4_4_ = fStack_24fc * auVar10._4_4_;
            auVar4._0_4_ = local_2500 * auVar10._0_4_;
            auVar4._8_4_ = fStack_24f8 * auVar10._8_4_;
            auVar4._12_4_ = fStack_24f4 * auVar10._12_4_;
            auVar4._16_4_ = fStack_24f0 * auVar10._16_4_;
            auVar4._20_4_ = fStack_24ec * auVar10._20_4_;
            auVar4._24_4_ = fStack_24e8 * auVar10._24_4_;
            auVar4._28_4_ = 0;
            auVar57._0_4_ = local_2500 * auVar11._0_4_;
            auVar57._4_4_ = fStack_24fc * auVar11._4_4_;
            auVar57._8_4_ = fStack_24f8 * auVar11._8_4_;
            auVar57._12_4_ = fStack_24f4 * auVar11._12_4_;
            auVar57._16_4_ = fStack_24f0 * auVar11._16_4_;
            auVar57._20_4_ = fStack_24ec * auVar11._20_4_;
            auVar57._24_4_ = fStack_24e8 * auVar11._24_4_;
            auVar57._28_4_ = 0;
            auVar19._4_4_ = uStack_24dc;
            auVar19._0_4_ = local_24e0;
            auVar19._8_4_ = uStack_24d8;
            auVar19._12_4_ = uStack_24d4;
            auVar19._16_4_ = uStack_24d0;
            auVar19._20_4_ = uStack_24cc;
            auVar19._24_4_ = uStack_24c8;
            auVar19._28_4_ = uStack_24c4;
            auVar38 = vfmadd231ps_fma(auVar4,auVar19,local_2460);
            auVar42 = vfmadd231ps_fma(auVar57,auVar19,local_2400);
            auVar20._4_4_ = uStack_24bc;
            auVar20._0_4_ = local_24c0;
            auVar20._8_4_ = uStack_24b8;
            auVar20._12_4_ = uStack_24b4;
            auVar20._16_4_ = uStack_24b0;
            auVar20._20_4_ = uStack_24ac;
            auVar20._24_4_ = uStack_24a8;
            auVar20._28_4_ = uStack_24a4;
            auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar20,local_2440);
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar20,local_2420);
            auVar71._8_4_ = 0x7fffffff;
            auVar71._0_8_ = 0x7fffffff7fffffff;
            auVar71._12_4_ = 0x7fffffff;
            auVar71._16_4_ = 0x7fffffff;
            auVar71._20_4_ = 0x7fffffff;
            auVar71._24_4_ = 0x7fffffff;
            auVar71._28_4_ = 0x7fffffff;
            auVar4 = vandps_avx(auVar71,ZEXT1632(auVar38));
            auVar67._8_4_ = 0x219392ef;
            auVar67._0_8_ = 0x219392ef219392ef;
            auVar67._12_4_ = 0x219392ef;
            auVar67._16_4_ = 0x219392ef;
            auVar67._20_4_ = 0x219392ef;
            auVar67._24_4_ = 0x219392ef;
            auVar67._28_4_ = 0x219392ef;
            auVar4 = vcmpps_avx(auVar4,auVar67,1);
            auVar5 = vblendvps_avx(ZEXT1632(auVar38),auVar67,auVar4);
            auVar4 = vandps_avx(auVar71,ZEXT1632(auVar42));
            auVar4 = vcmpps_avx(auVar4,auVar67,1);
            auVar57 = vblendvps_avx(ZEXT1632(auVar42),auVar67,auVar4);
            auVar6._4_4_ = fStack_24fc * auVar12._4_4_;
            auVar6._0_4_ = local_2500 * auVar12._0_4_;
            auVar6._8_4_ = fStack_24f8 * auVar12._8_4_;
            auVar6._12_4_ = fStack_24f4 * auVar12._12_4_;
            auVar6._16_4_ = fStack_24f0 * auVar12._16_4_;
            auVar6._20_4_ = fStack_24ec * auVar12._20_4_;
            auVar6._24_4_ = fStack_24e8 * auVar12._24_4_;
            auVar6._28_4_ = auVar4._28_4_;
            auVar38 = vfmadd231ps_fma(auVar6,auVar19,local_2480);
            auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar20,*pauVar1);
            auVar4 = vandps_avx(auVar71,ZEXT1632(auVar38));
            auVar6 = vcmpps_avx(auVar4,auVar67,1);
            auVar4 = vblendvps_avx(ZEXT1632(auVar38),auVar67,auVar6);
            auVar7._4_4_ = fVar46 * *(float *)(uVar25 + 0x1e4);
            auVar7._0_4_ = fVar46 * *(float *)(uVar25 + 0x1e0);
            auVar7._8_4_ = fVar46 * *(float *)(uVar25 + 0x1e8);
            auVar7._12_4_ = fVar46 * *(float *)(uVar25 + 0x1ec);
            auVar7._16_4_ = fVar46 * *(float *)(uVar25 + 0x1f0);
            auVar7._20_4_ = fVar46 * *(float *)(uVar25 + 500);
            auVar7._24_4_ = fVar46 * *(float *)(uVar25 + 0x1f8);
            auVar7._28_4_ = fStack_24e4;
            auVar37 = vfmadd231ps_fma(local_24a0,auVar72,ZEXT832(0) << 0x20);
            auVar49 = vfmadd231ps_fma(auVar7,auVar72,ZEXT832(0) << 0x20);
            auVar13._4_4_ = fVar46 * *(float *)(uVar25 + 0x204);
            auVar13._0_4_ = fVar46 * *(float *)(uVar25 + 0x200);
            auVar13._8_4_ = fVar46 * *(float *)(uVar25 + 0x208);
            auVar13._12_4_ = fVar46 * *(float *)(uVar25 + 0x20c);
            auVar13._16_4_ = fVar46 * *(float *)(uVar25 + 0x210);
            auVar13._20_4_ = fVar46 * *(float *)(uVar25 + 0x214);
            auVar13._24_4_ = fVar46 * *(float *)(uVar25 + 0x218);
            auVar13._28_4_ = uStack_24c4;
            auVar53 = vfmadd231ps_fma(auVar13,auVar72,ZEXT832(0) << 0x20);
            auVar58._0_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x220);
            auVar58._4_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x224);
            auVar58._8_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x228);
            auVar58._12_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x22c);
            auVar58._16_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x230);
            auVar58._20_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x234);
            auVar58._24_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x238);
            auVar58._28_4_ = fVar8 + auVar6._28_4_;
            auVar51._0_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x240);
            auVar51._4_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x244);
            auVar51._8_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x248);
            auVar51._12_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x24c);
            auVar51._16_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x250);
            auVar51._20_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x254);
            auVar51._24_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 600);
            auVar51._28_4_ = fVar8 + 0.0;
            auVar6 = vrcpps_avx(auVar5);
            auVar73._0_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x260);
            auVar73._4_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x264);
            auVar73._8_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x268);
            auVar73._12_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x26c);
            auVar73._16_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x270);
            auVar73._20_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x274);
            auVar73._24_4_ = fVar8 + fVar46 * *(float *)(uVar25 + 0x278);
            auVar73._28_4_ = fVar8 + 0.0;
            auVar7 = vrcpps_avx(auVar57);
            auVar68._8_4_ = 0x3f800000;
            auVar68._0_8_ = 0x3f8000003f800000;
            auVar68._12_4_ = 0x3f800000;
            auVar68._16_4_ = 0x3f800000;
            auVar68._20_4_ = 0x3f800000;
            auVar68._24_4_ = 0x3f800000;
            auVar68._28_4_ = 0x3f800000;
            auVar38 = vfnmadd213ps_fma(auVar5,auVar6,auVar68);
            auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar6,auVar6);
            auVar42 = vfnmadd213ps_fma(auVar57,auVar7,auVar68);
            auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar7,auVar7);
            auVar5 = vrcpps_avx(auVar4);
            auVar60 = vfnmadd213ps_fma(auVar4,auVar5,auVar68);
            auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar5,auVar5);
            auVar5._4_4_ = uStack_255c;
            auVar5._0_4_ = local_2560;
            auVar5._8_4_ = uStack_2558;
            auVar5._12_4_ = uStack_2554;
            auVar5._16_4_ = uStack_2550;
            auVar5._20_4_ = uStack_254c;
            auVar5._24_4_ = uStack_2548;
            auVar5._28_4_ = uStack_2544;
            auVar50 = vfmadd213ps_fma(auVar10,auVar5,*(undefined1 (*) [32])(uVar25 + 0x160));
            auVar10._4_4_ = uStack_253c;
            auVar10._0_4_ = local_2540;
            auVar10._8_4_ = uStack_2538;
            auVar10._12_4_ = uStack_2534;
            auVar10._16_4_ = uStack_2530;
            auVar10._20_4_ = uStack_252c;
            auVar10._24_4_ = uStack_2528;
            auVar10._28_4_ = uStack_2524;
            auVar54 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar10,local_2460);
            auVar50 = vfmadd213ps_fma(auVar11,auVar5,*(undefined1 (*) [32])(uVar25 + 0x180));
            auVar52 = vfmadd213ps_fma(auVar12,auVar5,*(undefined1 (*) [32])(uVar25 + 0x1a0));
            auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar10,local_2400);
            auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar10,local_2480);
            auVar11._4_4_ = uStack_251c;
            auVar11._0_4_ = local_2520;
            auVar11._8_4_ = uStack_2518;
            auVar11._12_4_ = uStack_2514;
            auVar11._16_4_ = uStack_2510;
            auVar11._20_4_ = uStack_250c;
            auVar11._24_4_ = uStack_2508;
            auVar11._28_4_ = uStack_2504;
            auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar11,local_2440);
            auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar11,local_2420);
            auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar11,*pauVar1);
            auVar10 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar54));
            auVar11 = vsubps_avx(auVar58,ZEXT1632(auVar54));
            auVar12 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar50));
            auVar4 = vsubps_avx(auVar51,ZEXT1632(auVar50));
            auVar5 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar52));
            auVar57 = vsubps_avx(auVar73,ZEXT1632(auVar52));
            auVar14._4_4_ = auVar38._4_4_ * auVar10._4_4_;
            auVar14._0_4_ = auVar38._0_4_ * auVar10._0_4_;
            auVar14._8_4_ = auVar38._8_4_ * auVar10._8_4_;
            auVar14._12_4_ = auVar38._12_4_ * auVar10._12_4_;
            auVar14._16_4_ = auVar10._16_4_ * 0.0;
            auVar14._20_4_ = auVar10._20_4_ * 0.0;
            auVar14._24_4_ = auVar10._24_4_ * 0.0;
            auVar14._28_4_ = auVar10._28_4_;
            auVar15._4_4_ = auVar38._4_4_ * auVar11._4_4_;
            auVar15._0_4_ = auVar38._0_4_ * auVar11._0_4_;
            auVar15._8_4_ = auVar38._8_4_ * auVar11._8_4_;
            auVar15._12_4_ = auVar38._12_4_ * auVar11._12_4_;
            auVar15._16_4_ = auVar11._16_4_ * 0.0;
            auVar15._20_4_ = auVar11._20_4_ * 0.0;
            auVar15._24_4_ = auVar11._24_4_ * 0.0;
            auVar15._28_4_ = auVar11._28_4_;
            auVar16._4_4_ = auVar42._4_4_ * auVar12._4_4_;
            auVar16._0_4_ = auVar42._0_4_ * auVar12._0_4_;
            auVar16._8_4_ = auVar42._8_4_ * auVar12._8_4_;
            auVar16._12_4_ = auVar42._12_4_ * auVar12._12_4_;
            auVar16._16_4_ = auVar12._16_4_ * 0.0;
            auVar16._20_4_ = auVar12._20_4_ * 0.0;
            auVar16._24_4_ = auVar12._24_4_ * 0.0;
            auVar16._28_4_ = auVar12._28_4_;
            auVar12._4_4_ = auVar60._4_4_ * auVar5._4_4_;
            auVar12._0_4_ = auVar60._0_4_ * auVar5._0_4_;
            auVar12._8_4_ = auVar60._8_4_ * auVar5._8_4_;
            auVar12._12_4_ = auVar60._12_4_ * auVar5._12_4_;
            auVar12._16_4_ = auVar5._16_4_ * 0.0;
            auVar12._20_4_ = auVar5._20_4_ * 0.0;
            auVar12._24_4_ = auVar5._24_4_ * 0.0;
            auVar12._28_4_ = auVar5._28_4_;
            auVar17._4_4_ = auVar42._4_4_ * auVar4._4_4_;
            auVar17._0_4_ = auVar42._0_4_ * auVar4._0_4_;
            auVar17._8_4_ = auVar42._8_4_ * auVar4._8_4_;
            auVar17._12_4_ = auVar42._12_4_ * auVar4._12_4_;
            auVar17._16_4_ = auVar4._16_4_ * 0.0;
            auVar17._20_4_ = auVar4._20_4_ * 0.0;
            auVar17._24_4_ = auVar4._24_4_ * 0.0;
            auVar17._28_4_ = auVar4._28_4_;
            auVar18._4_4_ = auVar60._4_4_ * auVar57._4_4_;
            auVar18._0_4_ = auVar60._0_4_ * auVar57._0_4_;
            auVar18._8_4_ = auVar60._8_4_ * auVar57._8_4_;
            auVar18._12_4_ = auVar60._12_4_ * auVar57._12_4_;
            auVar18._16_4_ = auVar57._16_4_ * 0.0;
            auVar18._20_4_ = auVar57._20_4_ * 0.0;
            auVar18._24_4_ = auVar57._24_4_ * 0.0;
            auVar18._28_4_ = auVar57._28_4_;
            auVar10 = vpminsd_avx2(auVar16,auVar17);
            auVar11 = vpminsd_avx2(auVar12,auVar18);
            auVar10 = vmaxps_avx(auVar10,auVar11);
            auVar5 = vpminsd_avx2(auVar14,auVar15);
            auVar4 = vpmaxsd_avx2(auVar14,auVar15);
            auVar11 = vpmaxsd_avx2(auVar16,auVar17);
            auVar12 = vpmaxsd_avx2(auVar12,auVar18);
            auVar12 = vminps_avx(auVar11,auVar12);
            auVar11 = vmaxps_avx(auVar56,auVar5);
            local_25a0 = vmaxps_avx(auVar11,auVar10);
            auVar10 = vminps_avx(auVar36._0_32_,auVar4);
            auVar10 = vminps_avx(auVar10,auVar12);
            auVar10 = vcmpps_avx(local_25a0,auVar10,2);
            auVar38 = auVar10._0_16_;
            auVar42 = auVar10._16_16_;
LAB_01998981:
            auVar38 = vpackssdw_avx(auVar38,auVar42);
          }
          else {
            auVar41._4_4_ = fVar46;
            auVar41._0_4_ = fVar46;
            auVar41._8_4_ = fVar46;
            auVar41._12_4_ = fVar46;
            auVar41._16_4_ = fVar46;
            auVar41._20_4_ = fVar46;
            auVar41._24_4_ = fVar46;
            auVar41._28_4_ = fVar46;
            auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar33),auVar41,
                                      *(undefined1 (*) [32])(uVar25 + 0x40 + uVar33));
            auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar62,auVar59);
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar32),auVar41,
                                      *(undefined1 (*) [32])(uVar25 + 0x40 + uVar32));
            auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar63,auVar69);
            auVar10 = vpmaxsd_avx2(ZEXT1632(auVar38),ZEXT1632(auVar42));
            auVar38 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + uVar34),auVar41,
                                      *(undefined1 (*) [32])(uVar25 + 0x40 + uVar34));
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar33 ^ 0x20)),
                                      auVar41,*(undefined1 (*) [32])
                                               (uVar25 + 0x40 + (uVar33 ^ 0x20)));
            auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar62,auVar59);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar32 ^ 0x20)),
                                      auVar41,*(undefined1 (*) [32])
                                               (uVar25 + 0x40 + (uVar32 ^ 0x20)));
            auVar60 = vfmadd213ps_fma(ZEXT1632(auVar60),auVar63,auVar69);
            auVar12 = vpminsd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar60));
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar25 + 0x100 + (uVar34 ^ 0x20)),
                                      auVar41,*(undefined1 (*) [32])
                                               (uVar25 + 0x40 + (uVar34 ^ 0x20)));
            auVar38 = vfmadd213ps_fma(ZEXT1632(auVar38),auVar66,auVar70);
            auVar42 = vfmadd213ps_fma(ZEXT1632(auVar42),auVar66,auVar70);
            auVar11 = vpmaxsd_avx2(ZEXT1632(auVar38),auVar56);
            local_25a0 = vpmaxsd_avx2(auVar10,auVar11);
            auVar10 = vpminsd_avx2(ZEXT1632(auVar42),auVar36._0_32_);
            auVar10 = vpminsd_avx2(auVar12,auVar10);
            auVar10 = vcmpps_avx(local_25a0,auVar10,2);
            if (uVar30 == 6) {
              auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar25 + 0x1c0),auVar41,2);
              auVar12 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar25 + 0x1e0),1);
              auVar11 = vandps_avx(auVar11,auVar12);
              auVar10 = vandps_avx(auVar11,auVar10);
              auVar38 = auVar10._0_16_;
              auVar42 = auVar10._16_16_;
              goto LAB_01998981;
            }
            auVar38 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          }
          auVar38 = vpsllw_avx(auVar38,0xf);
          if ((((((((auVar38 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar38 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar38 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar38 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar38[0xf]) goto LAB_01998cca;
          auVar38 = vpacksswb_avx(auVar38,auVar38);
          bVar9 = SUB161(auVar38 >> 7,0) & 1 | (SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar38 >> 0x17,0) & 1) << 2 | (SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar38 >> 0x27,0) & 1) << 4 | (SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar38 >> 0x37,0) & 1) << 6 | SUB161(auVar38 >> 0x3f,0) << 7;
          lVar24 = 0;
          for (uVar23 = (ulong)bVar9; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
          {
            lVar24 = lVar24 + 1;
          }
          uVar23 = *(ulong *)(uVar25 + lVar24 * 8);
          uVar30 = bVar9 - 1 & (uint)bVar9;
          uVar27 = (ulong)uVar30;
          pauVar21 = pauVar22;
          if (uVar30 != 0) {
            uVar48 = *(uint *)(local_25a0 + lVar24 * 4);
            lVar24 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar24 = lVar24 + 1;
            }
            uVar30 = uVar30 - 1 & uVar30;
            uVar31 = (ulong)uVar30;
            uVar27 = *(ulong *)(uVar25 + lVar24 * 8);
            uVar3 = *(uint *)(local_25a0 + lVar24 * 4);
            if (uVar30 == 0) {
              pauVar21 = pauVar22 + 1;
              if (uVar48 < uVar3) {
                *(ulong *)*pauVar22 = uVar27;
                *(uint *)(*pauVar22 + 8) = uVar3;
              }
              else {
                *(ulong *)*pauVar22 = uVar23;
                *(uint *)(*pauVar22 + 8) = uVar48;
                uVar23 = uVar27;
              }
            }
            else {
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar23;
              auVar38 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar48));
              auVar44._8_8_ = 0;
              auVar44._0_8_ = uVar27;
              auVar42 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar3));
              lVar24 = 0;
              for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar24 = lVar24 + 1;
              }
              uVar30 = uVar30 - 1 & uVar30;
              uVar23 = (ulong)uVar30;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = *(ulong *)(uVar25 + lVar24 * 8);
              auVar60 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_25a0 + lVar24 * 4)));
              if (uVar30 == 0) {
                auVar50 = vpcmpgtd_avx(auVar42,auVar38);
                auVar52 = vpshufd_avx(auVar50,0xaa);
                auVar50 = vblendvps_avx(auVar42,auVar38,auVar52);
                auVar38 = vblendvps_avx(auVar38,auVar42,auVar52);
                auVar42 = vpcmpgtd_avx(auVar60,auVar50);
                auVar52 = vpshufd_avx(auVar42,0xaa);
                auVar42 = vblendvps_avx(auVar60,auVar50,auVar52);
                auVar60 = vblendvps_avx(auVar50,auVar60,auVar52);
                auVar50 = vpcmpgtd_avx(auVar60,auVar38);
                auVar52 = vpshufd_avx(auVar50,0xaa);
                auVar50 = vblendvps_avx(auVar60,auVar38,auVar52);
                auVar38 = vblendvps_avx(auVar38,auVar60,auVar52);
                *pauVar22 = auVar38;
                pauVar22[1] = auVar50;
                uVar23 = auVar42._0_8_;
                pauVar21 = pauVar22 + 2;
              }
              else {
                lVar24 = 0;
                for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                  lVar24 = lVar24 + 1;
                }
                uVar30 = uVar30 - 1 & uVar30;
                uVar27 = (ulong)uVar30;
                auVar47._8_8_ = 0;
                auVar47._0_8_ = *(ulong *)(uVar25 + lVar24 * 8);
                auVar50 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_25a0 + lVar24 * 4)));
                if (uVar30 == 0) {
                  auVar52 = vpcmpgtd_avx(auVar42,auVar38);
                  auVar37 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar42,auVar38,auVar37);
                  auVar38 = vblendvps_avx(auVar38,auVar42,auVar37);
                  auVar42 = vpcmpgtd_avx(auVar50,auVar60);
                  auVar37 = vpshufd_avx(auVar42,0xaa);
                  auVar42 = vblendvps_avx(auVar50,auVar60,auVar37);
                  auVar60 = vblendvps_avx(auVar60,auVar50,auVar37);
                  auVar50 = vpcmpgtd_avx(auVar60,auVar38);
                  auVar37 = vpshufd_avx(auVar50,0xaa);
                  auVar50 = vblendvps_avx(auVar60,auVar38,auVar37);
                  auVar38 = vblendvps_avx(auVar38,auVar60,auVar37);
                  auVar60 = vpcmpgtd_avx(auVar42,auVar52);
                  auVar37 = vpshufd_avx(auVar60,0xaa);
                  auVar60 = vblendvps_avx(auVar42,auVar52,auVar37);
                  auVar42 = vblendvps_avx(auVar52,auVar42,auVar37);
                  auVar52 = vpcmpgtd_avx(auVar50,auVar42);
                  auVar37 = vpshufd_avx(auVar52,0xaa);
                  auVar52 = vblendvps_avx(auVar50,auVar42,auVar37);
                  auVar42 = vblendvps_avx(auVar42,auVar50,auVar37);
                  *pauVar22 = auVar38;
                  pauVar22[1] = auVar42;
                  pauVar22[2] = auVar52;
                  pauVar21 = pauVar22 + 3;
                  uVar23 = auVar60._0_8_;
                }
                else {
                  *pauVar22 = auVar38;
                  pauVar22[1] = auVar42;
                  pauVar22[2] = auVar60;
                  pauVar22[3] = auVar50;
                  lVar24 = 0x30;
                  do {
                    lVar28 = lVar24;
                    lVar24 = 0;
                    for (uVar23 = uVar27; (uVar23 & 1) == 0;
                        uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                      lVar24 = lVar24 + 1;
                    }
                    uVar23 = *(ulong *)(uVar25 + lVar24 * 8);
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = uVar23;
                    auVar38 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_25a0 + lVar24 * 4)));
                    *(undefined1 (*) [16])(pauVar22[1] + lVar28) = auVar38;
                    uVar27 = uVar27 - 1 & uVar27;
                    lVar24 = lVar28 + 0x10;
                  } while (uVar27 != 0);
                  pauVar21 = (undefined1 (*) [16])(pauVar22[1] + lVar28);
                  if (lVar28 + 0x10 != 0) {
                    lVar24 = 0x10;
                    pauVar26 = pauVar22;
                    do {
                      auVar38 = pauVar26[1];
                      pauVar26 = pauVar26 + 1;
                      uVar30 = vextractps_avx(auVar38,2);
                      lVar28 = lVar24;
                      do {
                        if (uVar30 <= *(uint *)(pauVar22[-1] + lVar28 + 8)) {
                          pauVar29 = (undefined1 (*) [16])(*pauVar22 + lVar28);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar22 + lVar28) =
                             *(undefined1 (*) [16])(pauVar22[-1] + lVar28);
                        lVar28 = lVar28 + -0x10;
                        pauVar29 = pauVar22;
                      } while (lVar28 != 0);
                      *pauVar29 = auVar38;
                      lVar24 = lVar24 + 0x10;
                    } while (pauVar21 != pauVar26);
                    uVar23 = *(ulong *)*pauVar21;
                  }
                }
              }
            }
          }
        }
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(uVar23 & 0xfffffffffffffff0) * 0x40))(local_23e0,ray,context);
        fVar46 = (ray->super_RayK<1>).tfar;
        auVar36 = ZEXT3264(CONCAT428(fVar46,CONCAT424(fVar46,CONCAT420(fVar46,CONCAT416(fVar46,
                                                  CONCAT412(fVar46,CONCAT48(fVar46,CONCAT44(fVar46,
                                                  fVar46))))))));
      }
LAB_01998cca:
    } while (pauVar22 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }